

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O2

void run_test(testing t)

{
  testing_base_s *ptVar1;
  char *__ptr;
  char *pcVar2;
  nsync_time nVar3;
  
  ptVar1 = t->base;
  fprintf((FILE *)t->fp,"%-25s %-45s  ",ptVar1->prog,t->name);
  fflush((FILE *)t->fp);
  (t->partial_line).super___atomic_base<unsigned_int>._M_i = 1;
  t->test_status = 0;
  t->n = 0;
  (t->stop_time).tv_sec = 0;
  (t->stop_time).tv_nsec = 0;
  nVar3 = nsync::nsync_time_now();
  t->start_time = nVar3;
  (*t->f)(t);
  nVar3 = nsync::nsync_time_now();
  nVar3 = nsync::nsync_time_sub(nVar3,t->start_time);
  __ptr = nsync_time_str(nVar3,2);
  if ((t->partial_line).super___atomic_base<unsigned_int>._M_i == 0) {
    pcVar2 = "failed";
    if (t->test_status == 0) {
      pcVar2 = "passed";
    }
    fprintf((FILE *)t->fp,"%-25s %-45s  %s %8s\n",ptVar1->prog,t->name,pcVar2,__ptr);
  }
  else {
    pcVar2 = "failed";
    if (t->test_status == 0) {
      pcVar2 = "passed";
    }
    fprintf((FILE *)t->fp,"%s %8s\n",pcVar2,__ptr);
  }
  (t->partial_line).super___atomic_base<unsigned_int>._M_i = 0;
  fflush((FILE *)t->fp);
  free(__ptr);
  finish_run(t);
  return;
}

Assistant:

static void run_test (testing t) {
	testing_base tb = t->base;
	char *elapsed_str = 0;
	fprintf (t->fp, "%-25s %-45s  ", tb->prog, t->name);
	fflush (t->fp);
	ATM_STORE (&t->partial_line, 1);
	t->test_status = 0;
	t->n = 0;
	t->stop_time = nsync_time_zero;
	t->start_time = nsync_time_now ();
	(*t->f) (t);
	elapsed_str = nsync_time_str (nsync_time_sub (nsync_time_now (), t->start_time), 2);
	if (!ATM_LOAD (&t->partial_line)) {
		fprintf (t->fp, "%-25s %-45s  %s %8s\n", tb->prog, t->name,
		         t->test_status != 0? "failed": "passed", elapsed_str);
	} else {
		fprintf (t->fp, "%s %8s\n", t->test_status != 0? "failed": "passed", elapsed_str);
	}
	ATM_STORE (&t->partial_line, 0);
	fflush (t->fp);
	free (elapsed_str);
	finish_run (t);
}